

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_double_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P)

{
  int iVar1;
  undefined1 local_88 [8];
  mbedtls_mpi U;
  mbedtls_mpi T;
  mbedtls_mpi S;
  mbedtls_mpi M;
  int ret;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  dbl_count = dbl_count + 1;
  mbedtls_mpi_init((mbedtls_mpi *)&S.p);
  mbedtls_mpi_init((mbedtls_mpi *)&T.p);
  mbedtls_mpi_init((mbedtls_mpi *)&U.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_88);
  if ((grp->A).p == (mbedtls_mpi_uint *)0x0) {
    M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T.p,&P->Z,&P->Z);
    if (((M.p._4_4_ == 0) &&
        (M.p._4_4_ = mbedtls_mpi_add_mod(grp,(mbedtls_mpi *)&U.p,&P->X,(mbedtls_mpi *)&T.p),
        M.p._4_4_ == 0)) &&
       ((M.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)local_88,&P->X,(mbedtls_mpi *)&T.p),
        M.p._4_4_ == 0 &&
        (M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T.p,(mbedtls_mpi *)&U.p,
                                         (mbedtls_mpi *)local_88), M.p._4_4_ == 0)))) {
      M.p._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&T.p,3);
      while (M.p._4_4_ == 0) {
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&S.p,&grp->P);
        if (iVar1 < 0) goto LAB_00110752;
        M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p,&grp->P);
      }
    }
  }
  else {
    M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T.p,&P->X,&P->X);
    if (M.p._4_4_ == 0) {
      M.p._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&T.p,3);
      while (M.p._4_4_ == 0) {
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&S.p,&grp->P);
        if (iVar1 < 0) {
          iVar1 = mbedtls_mpi_cmp_int(&grp->A,0);
          if ((iVar1 == 0) ||
             ((((M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T.p,&P->Z,&P->Z),
                M.p._4_4_ == 0 &&
                (M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&T.p,
                                                 (mbedtls_mpi *)&T.p), M.p._4_4_ == 0)) &&
               (M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T.p,(mbedtls_mpi *)&U.p,&grp->A)
               , M.p._4_4_ == 0)) &&
              (M.p._4_4_ = mbedtls_mpi_add_mod(grp,(mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p,
                                               (mbedtls_mpi *)&T.p), M.p._4_4_ == 0))))
          goto LAB_00110752;
          break;
        }
        M.p._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&S.p,(mbedtls_mpi *)&S.p,&grp->P);
      }
    }
  }
LAB_001109b8:
  mbedtls_mpi_free((mbedtls_mpi *)&S.p);
  mbedtls_mpi_free((mbedtls_mpi *)&T.p);
  mbedtls_mpi_free((mbedtls_mpi *)&U.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_88);
  return M.p._4_4_;
LAB_00110752:
  M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&U.p,&P->Y,&P->Y);
  if ((((M.p._4_4_ == 0) &&
       (M.p._4_4_ = mbedtls_mpi_shift_l_mod(grp,(mbedtls_mpi *)&U.p,1), M.p._4_4_ == 0)) &&
      ((((M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T.p,&P->X,(mbedtls_mpi *)&U.p),
         M.p._4_4_ == 0 &&
         (((M.p._4_4_ = mbedtls_mpi_shift_l_mod(grp,(mbedtls_mpi *)&T.p,1), M.p._4_4_ == 0 &&
           (M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_88,(mbedtls_mpi *)&U.p,
                                            (mbedtls_mpi *)&U.p), M.p._4_4_ == 0)) &&
          (M.p._4_4_ = mbedtls_mpi_shift_l_mod(grp,(mbedtls_mpi *)local_88,1), M.p._4_4_ == 0)))) &&
        (((M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&S.p,
                                           (mbedtls_mpi *)&S.p), M.p._4_4_ == 0 &&
          (M.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,
                                           (mbedtls_mpi *)&T.p), M.p._4_4_ == 0)) &&
         (M.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&U.p,(mbedtls_mpi *)&U.p,
                                          (mbedtls_mpi *)&T.p), M.p._4_4_ == 0)))) &&
       ((M.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,
                                         (mbedtls_mpi *)&U.p), M.p._4_4_ == 0 &&
        (M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,
                                         (mbedtls_mpi *)&S.p), M.p._4_4_ == 0)))))) &&
     ((M.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&T.p,(mbedtls_mpi *)&T.p,
                                       (mbedtls_mpi *)local_88), M.p._4_4_ == 0 &&
      ((((M.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_88,&P->Y,&P->Z), M.p._4_4_ == 0
         && (M.p._4_4_ = mbedtls_mpi_shift_l_mod(grp,(mbedtls_mpi *)local_88,1), M.p._4_4_ == 0)) &&
        (M.p._4_4_ = mbedtls_mpi_copy(&R->X,(mbedtls_mpi *)&U.p), M.p._4_4_ == 0)) &&
       (M.p._4_4_ = mbedtls_mpi_copy(&R->Y,(mbedtls_mpi *)&T.p), M.p._4_4_ == 0)))))) {
    M.p._4_4_ = mbedtls_mpi_copy(&R->Z,(mbedtls_mpi *)local_88);
  }
  goto LAB_001109b8;
}

Assistant:

static int ecp_double_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                           const mbedtls_ecp_point *P )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi M, S, T, U;

#if defined(MBEDTLS_SELF_TEST)
    dbl_count++;
#endif

#if defined(MBEDTLS_ECP_DOUBLE_JAC_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_double_jac( grp, R, P ) );
#endif /* MBEDTLS_ECP_DOUBLE_JAC_ALT */

    mbedtls_mpi_init( &M ); mbedtls_mpi_init( &S ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &U );

    /* Special case for A = -3 */
    if( grp->A.p == NULL )
    {
        /* M = 3(X + Z^2)(X - Z^2) */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->Z,  &P->Z   ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &T,  &P->X,  &S      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &U,  &P->X,  &S      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &T,     &U      ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );
    }
    else
    {
        /* M = 3.X^2 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->X,  &P->X   ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M,  &S,     3       ) ); MOD_ADD( M );

        /* Optimize away for "koblitz" curves with A = 0 */
        if( mbedtls_mpi_cmp_int( &grp->A, 0 ) != 0 )
        {
            /* M += A.Z^4 */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->Z,  &P->Z   ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &S,     &S      ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &T,     &grp->A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mod( grp, &M,  &M,     &S      ) );
        }
    }

    /* S = 4.X.Y^2 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &P->Y,  &P->Y   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &T,  1               ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &P->X,  &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &S,  1               ) );

    /* U = 8.Y^4 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &U,  &T,     &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &U,  1               ) );

    /* T = M^2 - 2.S */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T,  &M,     &M      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T,  &T,     &S      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T,  &T,     &S      ) );

    /* S = M(S - T) - U */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &S,  &S,     &T      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &S,  &S,     &M      ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &S,  &S,     &U      ) );

    /* U = 2.Y.Z */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &U,  &P->Y,  &P->Z   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &U,  1               ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &T ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &S ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &U ) );

cleanup:
    mbedtls_mpi_free( &M ); mbedtls_mpi_free( &S ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &U );

    return( ret );
}